

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void Am_Print_Key(ostream *os,Am_Slot_Key key)

{
  char *pcVar1;
  ostream *poVar2;
  undefined6 in_register_00000032;
  char *pcVar3;
  
  std::operator<<(os,"<");
  pcVar1 = Am_Get_Slot_Name(key);
  pcVar3 = "unnamed";
  if (pcVar1 != (char *)0x0) {
    pcVar3 = pcVar1;
  }
  std::operator<<(os,pcVar3);
  poVar2 = std::operator<<(os,"[");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)CONCAT62(in_register_00000032,key));
  std::operator<<(poVar2,"]>");
  return;
}

Assistant:

void
Am_Print_Key(std::ostream &os, Am_Slot_Key key)
{
  os << "<";
  const char *name = Am_Get_Slot_Name(key);
  if (name)
    os << name;
  else
    os << "unnamed";
  os << "[" << (int)key << "]>";
}